

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

btScalar __thiscall btSoftBody::getVolume(btSoftBody *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Node *pNVar4;
  Face *pFVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  if ((this->m_nodes).m_size < 1) {
    return 0.0;
  }
  lVar8 = (long)(this->m_faces).m_size;
  if (lVar8 < 1) {
    fVar10 = 0.0;
  }
  else {
    pNVar4 = (this->m_nodes).m_data;
    fVar1 = (pNVar4->m_x).m_floats[0];
    fVar2 = (pNVar4->m_x).m_floats[1];
    fVar3 = (pNVar4->m_x).m_floats[2];
    pFVar5 = (this->m_faces).m_data;
    fVar10 = 0.0;
    lVar9 = 0;
    do {
      lVar6 = *(long *)((long)pFVar5->m_n + lVar9);
      lVar7 = *(long *)((long)pFVar5->m_n + lVar9 + 8);
      fVar11 = *(float *)(lVar7 + 0x10) - fVar1;
      fVar15 = *(float *)(lVar7 + 0x14) - fVar2;
      fVar12 = *(float *)(lVar7 + 0x18) - fVar3;
      lVar7 = *(long *)((long)pFVar5->m_n + lVar9 + 0x10);
      fVar14 = *(float *)(lVar7 + 0x10) - fVar1;
      fVar13 = *(float *)(lVar7 + 0x14) - fVar2;
      fVar16 = *(float *)(lVar7 + 0x18) - fVar3;
      fVar10 = fVar10 + (fVar13 * fVar11 - fVar14 * fVar15) * (*(float *)(lVar6 + 0x18) - fVar3) +
                        (fVar12 * fVar14 - fVar16 * fVar11) * (*(float *)(lVar6 + 0x14) - fVar2) +
                        (fVar15 * fVar16 - fVar13 * fVar12) * (*(float *)(lVar6 + 0x10) - fVar1);
      lVar9 = lVar9 + 0x48;
    } while (lVar8 * 0x48 != lVar9);
  }
  return fVar10 / 6.0;
}

Assistant:

btScalar		btSoftBody::getVolume() const
{
	btScalar	vol=0;
	if(m_nodes.size()>0)
	{
		int i,ni;

		const btVector3	org=m_nodes[0].m_x;
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			const Face&	f=m_faces[i];
			vol+=btDot(f.m_n[0]->m_x-org,btCross(f.m_n[1]->m_x-org,f.m_n[2]->m_x-org));
		}
		vol/=(btScalar)6;
	}
	return(vol);
}